

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:537:11)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:537:11)>
          *this,ExceptionOrValue *output)

{
  Disposer *pDVar1;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> depResult;
  Own<capnp::MessageReader,_std::nullptr_t> local_3c8;
  NullableValue<capnp::MessageReaderAndFds> local_3b8;
  ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_> local_390;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> local_1e0;
  
  local_1e0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1e0.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_1e0.super_ExceptionOrValue);
  if (local_1e0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_390,
               &local_1e0.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_390.value.ptr.isSet = false;
    ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_> *)output,
               &local_390);
    ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_>::~ExceptionOr
              (&local_390);
  }
  else if (local_1e0.value.ptr.isSet == true) {
    Maybe<capnp::MessageReaderAndFds>::Maybe
              ((Maybe<capnp::MessageReaderAndFds> *)&local_3b8,&local_1e0.value.ptr.field_1.value);
    local_390.value.ptr.field_1.value.ptr.ptr = local_3b8.field_1.value.reader.ptr;
    if (local_3b8.isSet == true) {
      local_3c8.disposer = local_3b8.field_1.value.reader.disposer;
      local_3b8.field_1.value.reader.ptr = (MessageReader *)0x0;
    }
    else {
      local_3c8.disposer = (Disposer *)0x0;
      local_390.value.ptr.field_1.value.ptr.ptr = (MessageReader *)0x0;
    }
    pDVar1 = local_3c8.disposer;
    NullableValue<capnp::MessageReaderAndFds>::~NullableValue(&local_3b8);
    local_390.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_390.value.ptr.isSet = true;
    local_3c8.ptr = (MessageReader *)0x0;
    local_390.value.ptr.field_1.value.ptr.disposer = pDVar1;
    ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_> *)output,
               &local_390);
    ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>_>::~ExceptionOr
              (&local_390);
    Own<capnp::MessageReader,_std::nullptr_t>::dispose(&local_3c8);
  }
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr(&local_1e0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }